

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

int __thiscall QCss::Parser::init(Parser *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  ulong uVar2;
  byte in_DL;
  long in_FS_OFFSET;
  QTextStream stream;
  QFile file;
  QString styleSheet;
  QStringBuilder<QString,_char16_t> *in_stack_fffffffffffffec8;
  bool *symbols;
  QList<QCss::Symbol> *in_stack_fffffffffffffed0;
  QString *preprocessedInput;
  QString *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee8;
  Parser *this_00;
  bool *in_stack_ffffffffffffff08;
  QString *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  QDebug in_stack_ffffffffffffff38;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined2 local_92;
  QFileInfo local_90 [64];
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = this;
  QString::QString((QString *)in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->a);
  if ((bVar1 & 1) == 0) {
    QString::clear((QString *)in_stack_fffffffffffffed0);
  }
  else {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_50,(QString *)ctx);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffed0,
               (OpenModeFlag)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    uVar2 = QFile::open((QFlags_conflict *)&local_50);
    if ((uVar2 & 1) == 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this,(char *)in_stack_fffffffffffffed8,
                 (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(char *)in_stack_fffffffffffffec8);
      QMessageLogger::warning();
      QDebug::operator<<((QDebug *)CONCAT17(bVar1,in_stack_fffffffffffffee8),
                         in_stack_ffffffffffffff18);
      QDebug::operator<<((QDebug *)this,in_stack_fffffffffffffed8);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffff38);
      QString::clear((QString *)in_stack_fffffffffffffed0);
    }
    else {
      QFileInfo::QFileInfo(local_90,(QString *)&local_40);
      QFileInfo::absolutePath();
      local_92 = 0x2f;
      ::operator+(in_stack_fffffffffffffed8,(char16_t *)in_stack_fffffffffffffed0);
      ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffec8);
      QString::operator=((QString *)in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->a);
      QString::~QString((QString *)0xa39f2a);
      QStringBuilder<QString,_char16_t>::~QStringBuilder
                ((QStringBuilder<QString,_char16_t> *)0xa39f37);
      QString::~QString((QString *)0xa39f44);
      QFileInfo::~QFileInfo(local_90);
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_a8,(QIODevice *)&local_50);
      QTextStream::readAll();
      QString::operator=((QString *)in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->a);
      QString::~QString((QString *)0xa39fb2);
      QTextStream::~QTextStream((QTextStream *)&local_a8);
    }
    QFile::~QFile((QFile *)&local_50);
  }
  symbols = &this->hasEscapeSequences;
  this->hasEscapeSequences = false;
  QList<QCss::Symbol>::clear(in_stack_fffffffffffffed0);
  QList<QCss::Symbol>::reserve(&this_00->symbols,(qsizetype)in_stack_ffffffffffffff38.stream);
  preprocessedInput = (QString *)&stack0xffffffffffffff00;
  Scanner::preprocess(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  Scanner::scan(preprocessedInput,(QList<QCss::Symbol> *)symbols);
  QString::~QString((QString *)0xa3a096);
  this->index = 0;
  this->errorIndex = -1;
  QString::~QString((QString *)0xa3a0b3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void Parser::init(const QString &css, bool isFile)
{
    QString styleSheet = css;
    if (isFile) {
        QFile file(css);
        if (file.open(QFile::ReadOnly)) {
            sourcePath = QFileInfo(styleSheet).absolutePath() + u'/';
            QTextStream stream(&file);
            styleSheet = stream.readAll();
        } else {
            qWarning() << "QCss::Parser - Failed to load file " << css;
            styleSheet.clear();
        }
    } else {
        sourcePath.clear();
    }

    hasEscapeSequences = false;
    symbols.clear();
    symbols.reserve(8);
    Scanner::scan(Scanner::preprocess(styleSheet, &hasEscapeSequences), &symbols);
    index = 0;
    errorIndex = -1;
}